

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configFileHelpers.cpp
# Opt level: O0

bool helics::fileops::looksLikeCommandLine(string_view testString)

{
  bool bVar1;
  const_reference pvVar2;
  size_type sVar3;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_00000010;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  bool local_1;
  
  bVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18);
  if (bVar1) {
    local_1 = false;
  }
  else {
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::front
                       ((basic_string_view<char,_std::char_traits<char>_> *)&local_18);
    if (*pvVar2 == '-') {
      local_1 = true;
    }
    else {
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::front
                         ((basic_string_view<char,_std::char_traits<char>_> *)&local_18);
      if (((*pvVar2 != '\\') &&
          (pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::front
                              ((basic_string_view<char,_std::char_traits<char>_> *)&local_18),
          *pvVar2 != '#')) &&
         (pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::front
                             ((basic_string_view<char,_std::char_traits<char>_> *)&local_18),
         *pvVar2 != '{')) {
        sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find
                          (in_stack_00000010,testString._M_str,testString._M_len);
        return sVar3 != 0xffffffffffffffff;
      }
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool looksLikeCommandLine(std::string_view testString)
{
    if (testString.empty()) {
        return false;
    }
    if (testString.front() == '-') {
        return true;
    }
    if (testString.front() == '\\' || testString.front() == '#' || testString.front() == '{') {
        return false;
    }
    return testString.find(" -") != std::string_view::npos;
}